

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

string * __thiscall
Ratio::toStringVerbose
          (Ratio *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *leaf2NumMap)

{
  ostream *poVar1;
  ostream *__x;
  ulong uVar2;
  size_type sVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  Ratio *in_RSI;
  string *in_RDI;
  double dVar6;
  int i_1;
  int i;
  ostringstream ss;
  Bipartition *in_stack_fffffffffffffc58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd10;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd18;
  string local_2d8 [88];
  string local_280 [36];
  int local_25c;
  string local_220 [88];
  string local_1c8 [36];
  int local_1a4;
  int local_1a0;
  ostringstream local_190 [400];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,std::fixed);
  local_1a0 = (int)std::setprecision(8);
  std::operator<<(poVar1,(_Setprecision)local_1a0);
  dVar6 = getRatio(in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,dVar6);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)local_190,"Total length and corresponding edges dropped:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  __x = (ostream *)std::ostream::operator<<((ostream *)local_190,in_RSI->eLength);
  std::operator<<(__x,"\t");
  local_1a4 = 0;
  while( true ) {
    uVar2 = (ulong)local_1a4;
    sVar3 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(&in_RSI->eEdges);
    if (sVar3 <= uVar2) break;
    if (local_1a4 == 0) {
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[](&in_RSI->eEdges,0);
      Bipartition::getPartition(in_stack_fffffffffffffc58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)poVar1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__x);
      Bipartition::toStringVerbose(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      poVar4 = std::operator<<((ostream *)local_190,local_1c8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffc70);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (in_stack_fffffffffffffc60);
    }
    else {
      poVar4 = std::operator<<((ostream *)local_190,"\t\t");
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                (&in_RSI->eEdges,(long)local_1a4);
      Bipartition::getPartition(in_stack_fffffffffffffc58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)poVar1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__x);
      Bipartition::toStringVerbose(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      poVar4 = std::operator<<(poVar4,local_220);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_220);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffc70);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (in_stack_fffffffffffffc60);
    }
    local_1a4 = local_1a4 + 1;
  }
  poVar4 = std::operator<<((ostream *)local_190,"\nTotal length and corresponding edges added:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,in_RSI->fLength);
  std::operator<<(poVar4,"\t");
  local_25c = 0;
  while( true ) {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(long)local_25c;
    pvVar5 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(&in_RSI->fEdges);
    if (pvVar5 <= this_00) break;
    if (local_25c == 0) {
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[](&in_RSI->fEdges,0);
      Bipartition::getPartition(in_stack_fffffffffffffc58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)poVar1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__x);
      Bipartition::toStringVerbose(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      poVar4 = std::operator<<((ostream *)local_190,local_280);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_280);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (in_stack_fffffffffffffc60);
    }
    else {
      in_stack_fffffffffffffc60 =
           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::operator<<((ostream *)local_190,"\t\t");
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                (&in_RSI->fEdges,(long)local_25c);
      Bipartition::getPartition(in_stack_fffffffffffffc58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)poVar1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__x);
      Bipartition::toStringVerbose(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      in_stack_fffffffffffffc58 =
           (Bipartition *)std::operator<<((ostream *)in_stack_fffffffffffffc60,local_2d8);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffc58,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_2d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (in_stack_fffffffffffffc60);
    }
    local_25c = local_25c + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

string Ratio::toStringVerbose(const vector<string>& leaf2NumMap) {
    std::ostringstream ss;
    ss << std::fixed << std::setprecision(8);

    ss << getRatio() << endl;

    ss << "Total length and corresponding edges dropped:" << endl;

    ss << eLength << "\t";

    // list the edges dropped
    for (int i = 0; i < eEdges.size(); i++) {
        if (i == 0) {   // nice formatting
            ss << Bipartition::toStringVerbose(eEdges[i].getPartition(), leaf2NumMap) << endl;
        } else {
            ss << "\t\t" << Bipartition::toStringVerbose(eEdges[i].getPartition(), leaf2NumMap) << endl;
        }
    }

    ss << "\nTotal length and corresponding edges added:" << endl;

    ss << fLength << "\t";

    // list the edges added
    for (int i = 0; i < fEdges.size(); i++) {
        if (i == 0) {   // nice formatting
            ss << Bipartition::toStringVerbose(fEdges[i].getPartition(), leaf2NumMap) << endl;
        } else {
            ss << "\t\t" << Bipartition::toStringVerbose(fEdges[i].getPartition(), leaf2NumMap) << endl;
        }
    }

    return ss.str();

}